

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O3

bool P_PoisonPlayer(player_t *player,AActor *poisoner,AActor *source,int poison)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  if ((player->cheats & 2U) != 0) {
    return false;
  }
  if ((player->cheats & 0x2000000U) == 0 &&
      ((player->mo->super_AActor).flags2.Value & 0x8000000) == 0) {
    if (((source != (AActor *)0x0) && (source->player != player)) &&
       (bVar2 = AActor::IsTeammate(&player->mo->super_AActor,source), bVar2)) {
      poison = (int)((double)poison * level.teamdamage);
    }
    bVar2 = true;
    if (0 < poison) {
      iVar4 = poison + player->poisoncount;
      player->poisoncount = iVar4;
      (player->poisoner).field_0.p = source;
      if (poisoner == (AActor *)0x0) {
        (player->poisontype).Index = 0;
        iVar3 = 0;
      }
      else {
        iVar1 = (poisoner->DamageType).super_FName.Index;
        (player->poisontype).Index = iVar1;
        iVar3 = (poisoner->PainType).super_FName.Index;
        if (iVar3 == 0) {
          iVar3 = iVar1;
        }
      }
      (player->poisonpaintype).Index = iVar3;
      if (100 < iVar4) {
        player->poisoncount = 100;
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool P_PoisonPlayer (player_t *player, AActor *poisoner, AActor *source, int poison)
{
	if((player->cheats&CF_GODMODE) || (player->mo->flags2 & MF2_INVULNERABLE) || (player->cheats & CF_GODMODE2))
	{
		return false;
	}
	if (source != NULL && source->player != player && player->mo->IsTeammate (source))
	{
		poison = (int)(poison * level.teamdamage);
	}
	if (poison > 0)
	{
		player->poisoncount += poison;
		player->poisoner = source;
		if (poisoner == NULL)
		{
			player->poisontype = player->poisonpaintype = NAME_None;
		}
		else
		{ // We need to record these in case the poisoner disappears before poisoncount reaches 0.
			player->poisontype = poisoner->DamageType;
			player->poisonpaintype = poisoner->PainType != NAME_None ? poisoner->PainType : poisoner->DamageType;
		}
		if(player->poisoncount > 100)
		{
			player->poisoncount = 100;
		}
	}
	return true;
}